

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int luaL_ref(lua_State *L,int t)

{
  int iVar1;
  lua_Integer lVar2;
  size_t sVar3;
  int local_24;
  int local_20;
  int ref;
  int t_local;
  lua_State *L_local;
  
  local_24 = t;
  if ((t < 1) && (-10000 < t)) {
    iVar1 = lua_gettop(L);
    local_24 = iVar1 + t + 1;
  }
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    L_local._4_4_ = -1;
  }
  else {
    lua_rawgeti(L,local_24,0);
    lVar2 = lua_tointeger(L,-1);
    local_20 = (int)lVar2;
    lua_settop(L,-2);
    if (local_20 == 0) {
      sVar3 = lua_objlen(L,local_24);
      local_20 = (int)sVar3 + 1;
    }
    else {
      lua_rawgeti(L,local_24,local_20);
      lua_rawseti(L,local_24,0);
    }
    lua_rawseti(L,local_24,local_20);
    L_local._4_4_ = local_20;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_ref(lua_State *L, int t)
{
  int ref;
  t = abs_index(L, t);
  if (lua_isnil(L, -1)) {
    lua_pop(L, 1);  /* remove from stack */
    return LUA_REFNIL;  /* `nil' has a unique fixed reference */
  }
  lua_rawgeti(L, t, FREELIST_REF);  /* get first free element */
  ref = (int)lua_tointeger(L, -1);  /* ref = t[FREELIST_REF] */
  lua_pop(L, 1);  /* remove it from stack */
  if (ref != 0) {  /* any free element? */
    lua_rawgeti(L, t, ref);  /* remove it from list */
    lua_rawseti(L, t, FREELIST_REF);  /* (t[FREELIST_REF] = t[ref]) */
  } else {  /* no free elements */
    ref = (int)lua_objlen(L, t);
    ref++;  /* create new reference */
  }
  lua_rawseti(L, t, ref);
  return ref;
}